

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_10503b::RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test::TestBody
          (RedefsMIPTest_PureMILP__01__seemsPassedToBackendCorrectly_Test *this)

{
  initializer_list<mp::var::Type> tys;
  bool bVar1;
  char *in_R9;
  pointer this_00;
  pointer obj;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<mip_converter_test::MIPInstance::Objective> __l_01;
  initializer_list<double> lbs;
  initializer_list<double> __l_02;
  initializer_list<int> __l_03;
  initializer_list<mip_converter_test::MIPInstance::Constraint> __l_04;
  initializer_list<double> ubs;
  AssertionResult gtest_ar_;
  MIPInstance milp;
  Env e;
  MIPConverterTester tester;
  allocator_type local_87a6;
  allocator_type local_87a5;
  allocator_type local_87a4;
  allocator_type local_87a3;
  allocator_type local_87a2;
  allocator_type local_87a1;
  vector<int,_std::allocator<int>_> local_87a0;
  string local_8788;
  internal local_8768;
  undefined7 uStack_8767;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_8760;
  undefined8 local_8758;
  AssertHelper local_8748;
  undefined8 uStack_8740;
  undefined8 local_8738;
  vector<int,_std::allocator<int>_> local_8728;
  vector<double,_std::allocator<double>_> local_8710;
  iterator local_86f8;
  undefined8 uStack_86f0;
  undefined8 local_86e8;
  undefined8 uStack_86e0;
  MIPInstance local_86d0;
  int local_85fc [9];
  double local_85d8 [4];
  double local_85b8 [3];
  undefined1 local_85a0 [24];
  pointer local_8588;
  Interrupter local_8580;
  _Alloc_hider local_8570;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  local_82b8;
  
  local_85a0._0_4_ = minimize_;
  local_8768 = (internal)0x0;
  uStack_8767 = 0x3ff00000000000;
  sStack_8760.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000;
  local_8758 = 0x4004000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_8768;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_8788,__l,&local_87a1);
  local_85fc[6] = 0;
  local_85fc[7] = 1;
  local_85fc[8] = 2;
  __l_00._M_len = 3;
  __l_00._M_array = local_85fc + 6;
  std::vector<int,_std::allocator<int>_>::vector(&local_87a0,__l_00,&local_87a2);
  mip_converter_test::MIPInstance::SparseVec::SparseVec
            ((SparseVec *)(local_85a0 + 8),(vector<double,_std::allocator<double>_> *)&local_8788,
             &local_87a0);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_85a0;
  std::
  vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
  ::vector(&local_86d0.objs_,__l_01,&local_87a3);
  local_8748.data_ = (AssertHelperData *)0x0;
  uStack_8740 = 0;
  local_8738 = 0xbff3333333333333;
  local_85b8[0] = 1.0;
  local_85b8[1] = 3.0;
  local_85b8[2] = 5.2;
  local_86f8 = (iterator)(local_85fc + 3);
  local_85fc[3] = 1;
  local_85fc[4] = 0;
  local_85fc[5] = 0;
  uStack_86f0 = 3;
  local_86e8 = 0;
  uStack_86e0 = 0;
  tys._M_len = 3;
  tys._M_array = local_86f8;
  lbs._M_len = 3;
  lbs._M_array = (iterator)&local_8748;
  ubs._M_len = 3;
  ubs._M_array = local_85b8;
  mp::VarArrayDef::VarArrayDef
            (&local_86d0.vars_,lbs,ubs,tys,(initializer_list<const_char_*>)ZEXT816(0));
  local_85d8[0] = 2.0;
  local_85d8[1] = 0.0;
  local_85d8[2] = 4.0;
  __l_02._M_len = 3;
  __l_02._M_array = local_85d8;
  std::vector<double,_std::allocator<double>_>::vector(&local_8710,__l_02,&local_87a4);
  local_85fc[0] = 0;
  local_85fc[1] = 1;
  local_85fc[2] = 2;
  __l_03._M_len = 3;
  __l_03._M_array = local_85fc;
  std::vector<int,_std::allocator<int>_>::vector(&local_8728,__l_03,&local_87a5);
  mip_converter_test::MIPInstance::SparseVec::SparseVec
            ((SparseVec *)&local_82b8,&local_8710,&local_8728);
  local_82b8.
  super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
  .factory_.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0xd4b249ad2594c37d;
  local_82b8.
  super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
  .factory_.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x404c333333333333;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_82b8;
  std::
  vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
  ::vector(&local_86d0.cons_,__l_04,&local_87a6);
  if (local_82b8.
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .factory_.exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_82b8.
                    super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                    .factory_.exprs_.
                    super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (long)local_82b8.
                          super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                          .factory_.funcs_.
                          super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_82b8.
                          super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                          .factory_.exprs_.
                          super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_82b8.
      super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
      .
      super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
      ._vptr_BasicExprVisitor != (_func_int **)0x0) {
    operator_delete((void *)local_82b8.
                            super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                            .
                            super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                            .
                            super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
                            ._vptr_BasicExprVisitor,
                    (long)local_82b8.
                          super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                          .factory_.exprs_.
                          super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)local_82b8.
                          super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                          .
                          super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
                          .
                          super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
                          ._vptr_BasicExprVisitor);
  }
  if (local_8728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8728.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8728.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8728.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8710.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_8710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8710.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8580._vptr_Interrupter != (_func_int **)0x0) {
    operator_delete(local_8580._vptr_Interrupter,
                    (long)local_8570._M_p - (long)local_8580._vptr_Interrupter);
  }
  if ((_func_int **)local_85a0._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_85a0._8_8_,(long)local_8588 - local_85a0._8_8_);
  }
  if ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8788._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_8788._M_dataplus._M_p,
                    local_8788.field_2._M_allocated_capacity - (long)local_8788._M_dataplus._M_p);
  }
  mp::BasicSolver::BasicSolver((BasicSolver *)local_85a0);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ProblemFlattener(&local_82b8,(Env *)local_85a0);
  local_82b8.
  super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
  .
  super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
  .
  super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
  ._vptr_BasicExprVisitor =
       (BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
        )&PTR__ProblemFlattener_00444e58;
  local_82b8.super_BasicConverter<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  _vptr_BasicConverter = (_func_int **)&PTR__MIPConverterTester_00444f00;
  local_82b8.super_BasicProblemFlattener._vptr_BasicProblemFlattener =
       (_func_int **)&PTR__MIPConverterTester_00444f60;
  mip_converter_test::feedInstance<mip_converter_test::MIPConverterTester>
            ((MIPConverterTester *)&local_82b8,&local_86d0);
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ConvertModel(&local_82b8);
  this_00 = local_82b8.flat_cvt_.
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .modelapi_.instance_.objs_.
            super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
            ._M_impl.super__Vector_impl_data._M_start;
  obj = local_86d0.objs_.
        super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_82b8.flat_cvt_.
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .modelapi_.instance_.objs_.
            super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_82b8.flat_cvt_.
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .modelapi_.instance_.objs_.
            super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)local_86d0.objs_.
            super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_86d0.objs_.
            super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    for (; this_00 !=
           local_82b8.flat_cvt_.
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .modelapi_.instance_.objs_.
           super__Vector_base<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
           ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar1 = mip_converter_test::MIPInstance::Objective::operator==(this_00,obj);
      if (!bVar1) goto LAB_0012ed7f;
      obj = obj + 1;
    }
    local_8768 = (internal)0x1;
    sStack_8760.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_8760,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_8768 = (internal)
                 mip_converter_test::MIPInstance::VarBoundsEqual
                           (&local_82b8.flat_cvt_.
                             super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             .
                             super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                             .modelapi_.instance_,&local_86d0);
    sStack_8760.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_8768) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_8760,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_8768 = (internal)
                   ((long)local_82b8.flat_cvt_.
                          super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          .
                          super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          .modelapi_.instance_.cons_.
                          super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_82b8.flat_cvt_.
                          super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          .
                          super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          .modelapi_.instance_.cons_.
                          super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                   (long)local_86d0.cons_.
                         super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_86d0.cons_.
                         super__Vector_base<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      sStack_8760.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!(bool)local_8768) {
        testing::Message::Message((Message *)&local_87a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_8788,&local_8768,(AssertionResult *)"tester.NConstrEqual(milp)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_8748,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-mip-test.cpp"
                   ,0x35,local_8788._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_8748,(Message *)&local_87a0);
        testing::internal::AssertHelper::~AssertHelper(&local_8748);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8788._M_dataplus._M_p != &local_8788.field_2) {
          operator_delete(local_8788._M_dataplus._M_p,local_8788.field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0)) {
            (**(code **)(*(long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_8760,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::Message::Message((Message *)&local_87a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_8788,&local_8768,(AssertionResult *)"tester.VarBoundsEqual(milp)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_8748,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-mip-test.cpp"
                 ,0x34,local_8788._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_8748,(Message *)&local_87a0);
      testing::internal::AssertHelper::~AssertHelper(&local_8748);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8788._M_dataplus._M_p != &local_8788.field_2) {
        operator_delete(local_8788._M_dataplus._M_p,local_8788.field_2._M_allocated_capacity + 1);
      }
      if ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0)) {
          (**(code **)(*(long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_8760,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
LAB_0012ed7f:
    local_8768 = (internal)0x0;
    sStack_8760.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_87a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8788,&local_8768,(AssertionResult *)"tester.ObjsEqual(milp)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_8748,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/converter-mip-test.cpp"
               ,0x33,local_8788._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_8748,(Message *)&local_87a0);
    testing::internal::AssertHelper::~AssertHelper(&local_8748);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8788._M_dataplus._M_p != &local_8788.field_2) {
      operator_delete(local_8788._M_dataplus._M_p,local_8788.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_87a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_8760,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  mp::
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~ProblemFlattener(&local_82b8);
  mp::BasicSolver::~BasicSolver((BasicSolver *)local_85a0);
  std::
  vector<mip_converter_test::MIPInstance::Constraint,_std::allocator<mip_converter_test::MIPInstance::Constraint>_>
  ::~vector(&local_86d0.cons_);
  if (local_86d0.vars_.names_.save_.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_86d0.vars_.names_.save_.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_86d0.vars_.names_.save_.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_86d0.vars_.names_.save_.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_86d0.vars_.types_.save_.
      super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_86d0.vars_.types_.save_.
                    super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_86d0.vars_.types_.save_.
                          super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_86d0.vars_.types_.save_.
                          super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_86d0.vars_.ubs_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_86d0.vars_.ubs_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_86d0.vars_.ubs_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_86d0.vars_.ubs_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_86d0.vars_.lbs_.save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_86d0.vars_.lbs_.save_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_86d0.vars_.lbs_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_86d0.vars_.lbs_.save_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<mip_converter_test::MIPInstance::Objective,_std::allocator<mip_converter_test::MIPInstance::Objective>_>
  ::~vector(&local_86d0.objs_);
  return;
}

Assistant:

TEST(RedefsMIPTest, PureMILP__01__seemsPassedToBackendCorrectly) {
  MIPInstance milp {
    { { minimize_,
        { { 1, 1, 2.5 },
          { 0, 1, 2 } } } },
    { {  0.0,  0.0, -1.2 },
      {  1.0,  3.0,  5.2 },
      {  I_,   F_,   F_ } },
    {
      { { { 2, 0.0, 4 },
          { 0, 1,   2 } }, -infty_, 56.4 }
    }
  };
  mp::Env e;
  MIPConverterTester tester(e);
  feedInstance(tester, milp);
  tester.ConvertModel();
  ASSERT_TRUE(tester.ObjsEqual(milp));
  ASSERT_TRUE(tester.VarBoundsEqual(milp));
  ASSERT_TRUE(tester.NConstrEqual(milp));
}